

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_record.c
# Opt level: O2

_Bool load_local_record(cacheset *cacheset,char *filename)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  int *piVar5;
  cacheset *Cache;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint local_504;
  IP IP;
  char ip [32];
  char name [513];
  char buffer [630];
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    piVar5 = __errno_location();
    pcVar4 = strerror(*piVar5);
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/local_record.c"
            ,0x15,"file open error:%s",pcVar4);
  }
  else {
    iVar9 = 0;
    while (pcVar4 = fgets(buffer,0x276,__stream), pcVar4 != (char *)0x0) {
      iVar9 = iVar9 + (uint)(buffer._0_2_ != 10);
    }
    log_log(2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/local_record.c"
            ,0x1d,"read %d lines");
    rewind(__stream);
    iVar8 = iVar9 * 2;
    uVar6 = 0;
    local_504 = 0;
    iVar3 = 0;
    iVar2 = iVar9;
    iVar7 = iVar8;
    do {
      iVar7 = -iVar7;
      do {
        iVar7 = iVar7 + 1;
        if (iVar7 == 1) goto LAB_0010169a;
        iVar1 = __isoc99_fscanf(__stream,"%s%s",ip,name);
      } while (iVar1 != 2);
      iVar1 = inet_pton(2,ip,&IP);
      if (iVar1 == 1) {
        if (IP.addr.field_0 == 0) {
          iVar3 = iVar3 + 1;
        }
        else {
          uVar6 = (ulong)((int)uVar6 + 1);
        }
      }
      else {
        iVar1 = inet_pton(10,ip,&IP);
        if (iVar1 == 1) {
          if (CONCAT44(IP.addr._4_4_,IP.addr.field_0) == 0 && IP.addr._8_8_ == 0) {
            iVar3 = iVar3 + 1;
          }
          else {
            log_log(2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/local_record.c"
                    ,0x2f,"-------------%s",ip);
            local_504 = local_504 + 1;
          }
        }
      }
      iVar7 = -iVar7;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
LAB_0010169a:
    log_log(2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/local_record.c"
            ,0x39,"v4 = %d,v6 = %d,black=%d",uVar6,(ulong)local_504,iVar3);
    if (0 < (int)uVar6) {
      init_staticCache(&(cacheset->A).local,(int)uVar6);
    }
    if (0 < (int)local_504) {
      init_staticCache(&(cacheset->A).local,local_504);
    }
    if (0 < iVar3) {
      init_staticCache(&cacheset->blacklist,iVar3);
    }
    rewind(__stream);
    do {
      iVar8 = -iVar8;
      do {
        iVar8 = iVar8 + 1;
        if (iVar8 == 1) goto LAB_001017d5;
        iVar3 = __isoc99_fscanf(__stream,"%s%s",ip,name);
      } while (iVar3 != 2);
      iVar3 = inet_pton(2,ip,&IP);
      if (iVar3 == 1) {
        IP.type = '\x04';
        Cache = (cacheset *)&(cacheset->A).local;
        if (IP.addr.field_0 == 0) {
LAB_001017b6:
          Cache = cacheset;
        }
LAB_001017bb:
        set_static_cache(&Cache->blacklist,name,&IP);
      }
      else {
        iVar3 = inet_pton(10,ip,&IP);
        if (iVar3 == 1) {
          IP.type = '\x06';
          Cache = (cacheset *)&(cacheset->AAAA).local;
          if (CONCAT44(IP.addr._4_4_,IP.addr.field_0) == 0 && IP.addr._8_8_ == 0) goto LAB_001017b6;
          goto LAB_001017bb;
        }
      }
      iVar8 = -iVar8;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
LAB_001017d5:
    log_log(2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/local_record.c"
            ,0x5b,"read local record done");
  }
  return __stream != (FILE *)0x0;
}

Assistant:

bool load_local_record(struct cacheset *cacheset,const char* filename){
    char buffer[630];
    char name[513];
    char ip[32];
    struct IP IP;
    FILE* file;
    int line=0,_line;
    int v4 = 0,v6 = 0,black=0;
    int sizeofip = sizeof(struct IP);

    if( (file =fopen(filename,"r"))==NULL){
        log_error("file open error:%s",strerror(errno));
        return false;
    }
    while (fgets(buffer, 630, file)){
        if(strcmp(buffer,"\n")){
            line++; // 非空行
        }
    }
    log_info("read %d lines",line);

    // 首先扫一遍，确定个数
    rewind(file);
    _line = line;
    int _ = _line*2;//防止无限循环
    while(_--){
        if (fscanf(file, "%s%s",ip,name)==2){
            if (inet_pton(AF_INET,ip,&IP.addr)==1){
                if(IP.addr.v4 == 0){
                    black++;
                }else{
                    v4++;
                }
            }else if (inet_pton(PF_INET6,ip,&IP.addr)==1){
                 if(IP.addr.v6==0){
                    black++;
                }else{
                    log_info("-------------%s",ip);
                    v6++;
                }
            }
            _line--;
            if(_line==0)break;
        }
    }


    log_info("v4 = %d,v6 = %d,black=%d",v4,v6,black);
    // 初始化集合
    if(v4>0){
        init_staticCache(&cacheset->A.local,v4);
    }
    if(v6>0){
        init_staticCache(&cacheset->A.local,v6);
    }
    if(black>0){
        init_staticCache(&cacheset->blacklist,black);
    }
    rewind(file);
     _ = line*2;//防止无限循环
    while(_--){
        if (fscanf(file, "%s%s",ip,name)==2){
            if (inet_pton(AF_INET,ip,&IP.addr)==1){
                IP.type = IPV4;
                if(IP.addr.v4==0){
                    set_static_cache(&cacheset->blacklist,name,&IP);
                }else{
                    set_static_cache(&cacheset->A.local,name,&IP);
                }
            }else if (inet_pton(PF_INET6,ip,&IP.addr)==1){
                IP.type = IPV6;
                 if(IP.addr.v6==0){
                    set_static_cache(&cacheset->blacklist,name,&IP);
                }else{
                    set_static_cache(&cacheset->AAAA.local,name,&IP);
                }
            }
            line--;
            if(line==0)break;
        }
    }
    log_info("read local record done");
    return true;
}